

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::XPathScanner::scanExpression
          (XPathScanner *this,XMLCh *data,XMLSize_t currentOffset,XMLSize_t endOffset,
          ValueVectorOf<int> *tokens)

{
  XMLCh *pXVar1;
  char cVar2;
  XMLStringPool *pXVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  _func_int *p_Var8;
  XPathException *pXVar9;
  undefined1 uVar10;
  undefined8 uVar11;
  bool bVar12;
  XMLSize_t XVar13;
  ulong uVar14;
  XPathScanner *this_00;
  bool bVar15;
  XMLCh XVar16;
  XMLSize_t XVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  XMLCh str [2];
  XMLBuffer dataBuffer;
  XMLSize_t local_90;
  int local_84;
  XMLCh local_74 [2];
  XMLBuffer local_70;
  long local_38;
  
  local_70.fMemoryManager = tokens->fMemoryManager;
  local_70.fIndex = 0;
  local_70.fCapacity = 0x80;
  local_70.fFullSize = 0;
  local_70.fUsed = false;
  local_70.fFullHandler = (XMLBufferFullHandler *)0x0;
  local_70.fBuffer = (XMLCh *)0x0;
  iVar4 = (*(local_70.fMemoryManager)->_vptr_MemoryManager[3])(local_70.fMemoryManager,0x102);
  local_70.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar4);
  bVar15 = false;
  *local_70.fBuffer = L'\0';
  local_38 = 2 - endOffset;
  do {
    bVar20 = true;
    if (currentOffset == endOffset) goto LAB_0031a411;
    do {
      local_74[0] = data[currentOffset];
      XVar13 = currentOffset;
      if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)local_74[0]]) break;
      currentOffset = currentOffset + 1;
      XVar13 = endOffset;
    } while (endOffset != currentOffset);
    if (XVar13 == endOffset) goto LAB_0031a411;
    uVar10 = 0x19;
    if ((ushort)local_74[0] < 0x80) {
      uVar10 = fASCIICharMap[(ushort)local_74[0]];
    }
    switch(uVar10) {
    case 3:
      currentOffset = XVar13 + 1;
      if ((currentOffset != endOffset) && (data[XVar13 + 1] == L'=')) {
        (*this->_vptr_XPathScanner[2])(this,tokens,0x1b);
        goto LAB_00319d0e;
      }
LAB_00319b15:
      bVar20 = false;
      goto LAB_00319afa;
    case 4:
      local_90 = XVar13 + 1;
      if (local_90 == endOffset) {
        bVar20 = false;
      }
      else {
        XVar16 = data[local_90];
        XVar13 = local_90;
        while (XVar16 != local_74[0]) {
          if (local_38 + XVar13 == 1) {
            bVar20 = false;
            local_90 = endOffset;
            goto LAB_00319fec;
          }
          XVar16 = data[XVar13 + 1];
          XVar13 = XVar13 + 1;
        }
        (*this->_vptr_XPathScanner[2])(this,tokens,0x2e);
        local_70.fIndex = 0;
        XMLBuffer::append(&local_70,data + local_90,XVar13 - local_90);
        pXVar3 = this->fStringPool;
        local_70.fBuffer[local_70.fIndex] = L'\0';
        iVar4 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
        ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
        XVar17 = tokens->fCurCount;
        tokens->fCurCount = XVar17 + 1;
        tokens->fElemList[XVar17] = iVar4;
        bVar15 = true;
        bVar20 = true;
        local_90 = XVar13 + 1;
      }
LAB_00319fec:
      if (!bVar20) {
        bVar20 = false;
        currentOffset = local_90;
        goto LAB_00319afa;
      }
      goto LAB_00319af5;
    case 5:
      currentOffset = XVar13 + 1;
      if (currentOffset == endOffset) goto LAB_00319b15;
      XVar17 = currentOffset;
      if (((ulong)(ushort)data[currentOffset] != 0x3a) &&
         (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[currentOffset]] & 2) != 0)) {
        uVar18 = XVar13 + 2;
        uVar19 = uVar18;
        if (uVar18 < endOffset) {
          uVar19 = endOffset;
        }
        do {
          uVar14 = uVar18;
          XVar17 = uVar19;
          if (endOffset <= uVar14) break;
          uVar18 = uVar14 + 1;
          XVar17 = uVar14;
        } while (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[uVar14]] & 1) != 0);
      }
      local_90 = XVar17;
      if (XVar17 - currentOffset != 0) {
        if (XVar17 < endOffset) {
          bVar20 = data[XVar17] == L':';
        }
        else {
          bVar20 = false;
        }
        local_70.fIndex = 0;
        XMLBuffer::append(&local_70,data + currentOffset,XVar17 - currentOffset);
        pXVar3 = this->fStringPool;
        local_70.fBuffer[local_70.fIndex] = L'\0';
        iVar5 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
        iVar4 = iVar5;
        iVar6 = -1;
        if (bVar20) {
          currentOffset = XVar17 + 1;
          if (currentOffset == endOffset) goto LAB_00319b15;
          local_90 = currentOffset;
          if (((ulong)(ushort)data[currentOffset] != 0x3a) &&
             (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[currentOffset]] & 2) != 0)) {
            uVar18 = XVar17 + 2;
            XVar13 = uVar18;
            if (uVar18 < endOffset) {
              XVar13 = endOffset;
            }
            do {
              local_90 = XVar13;
              if (endOffset <= uVar18) break;
              pXVar1 = data + uVar18;
              local_90 = uVar18;
              uVar18 = uVar18 + 1;
            } while (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar1] & 1) != 0);
          }
          if (local_90 - currentOffset == 0) goto LAB_0031a262;
          local_70.fIndex = 0;
          XMLBuffer::append(&local_70,data + currentOffset,local_90 - currentOffset);
          pXVar3 = this->fStringPool;
          local_70.fBuffer[local_70.fIndex] = L'\0';
          iVar4 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
          iVar6 = iVar5;
        }
        (*this->_vptr_XPathScanner[2])(this,tokens,0x30);
        ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
        XVar13 = tokens->fCurCount;
        tokens->fCurCount = XVar13 + 1;
        tokens->fElemList[XVar13] = iVar6;
        ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
        XVar13 = tokens->fCurCount;
        tokens->fCurCount = XVar13 + 1;
        tokens->fElemList[XVar13] = iVar4;
        goto LAB_00319f84;
      }
LAB_0031a262:
      bVar20 = false;
      currentOffset = local_90;
      goto LAB_00319afa;
    case 6:
      (*this->_vptr_XPathScanner[2])(this,tokens,0);
      break;
    case 7:
      (*this->_vptr_XPathScanner[2])(this,tokens,1);
      goto LAB_003199e8;
    case 8:
      bVar15 = !bVar15;
      if (bVar15) {
        (*this->_vptr_XPathScanner[2])(this,tokens,9);
      }
      else {
        (*this->_vptr_XPathScanner[2])(this,tokens,0x14);
      }
      local_90 = XVar13 + 1;
      goto LAB_00319af5;
    case 9:
      (*this->_vptr_XPathScanner[2])(this,tokens,0x18);
      break;
    case 10:
      (*this->_vptr_XPathScanner[2])(this,tokens,7);
      break;
    case 0xb:
      (*this->_vptr_XPathScanner[2])(this,tokens,0x19);
      break;
    case 0xc:
      local_90 = XVar13 + 1;
      if (local_90 == endOffset) {
LAB_00319aa6:
        (*this->_vptr_XPathScanner[2])(this,tokens,4);
        bVar15 = true;
        goto LAB_00319af5;
      }
      local_74[0] = data[XVar13 + 1];
      if ((ulong)(ushort)local_74[0] != 0x2e) {
        if ((ushort)(local_74[0] + L'￐') < 10) goto switchD_00319808_caseD_e;
        if ((local_74[0] == L'|') || (local_74[0] == L'/')) goto LAB_00319aa6;
        if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)local_74[0]]) {
          local_74[1] = 0;
          pXVar9 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (pXVar9,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x37c,XPath_InvalidChar,local_74,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     tokens->fMemoryManager);
          __cxa_throw(pXVar9,&XPathException::typeinfo,XMLException::~XMLException);
        }
        XVar17 = XVar13 + 1;
        bVar20 = XVar17 == endOffset;
        if (bVar20) {
LAB_0031a188:
          uVar7 = (uint)(ushort)local_74[0];
          local_90 = XVar17;
        }
        else {
          local_74[0] = data[XVar13 + 1];
          uVar18 = (ulong)(ushort)local_74[0];
          if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar18]) goto LAB_0031a188;
          do {
            uVar7 = (uint)uVar18;
            bVar20 = local_38 + XVar17 == 1;
            local_90 = endOffset;
            if (bVar20) break;
            uVar18 = (ulong)(ushort)data[XVar17 + 1];
            uVar7 = (uint)(ushort)data[XVar17 + 1];
            local_90 = XVar17 + 1;
            XVar17 = local_90;
          } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar18] < '\0');
        }
        if (((bVar20) || ((short)uVar7 == 0x7c)) || (uVar7 == 0x2f)) {
          (*this->_vptr_XPathScanner[2])(this,tokens,4);
          bVar15 = true;
        }
        goto LAB_00319af5;
      }
      (*this->_vptr_XPathScanner[2])(this,tokens,5);
      local_90 = XVar13 + 2;
      goto LAB_003199eb;
    case 0xd:
      if (XVar13 + 1 == endOffset) {
        p_Var8 = this->_vptr_XPathScanner[2];
      }
      else {
        p_Var8 = this->_vptr_XPathScanner[2];
        if (data[XVar13 + 1] == L'/') {
          (*p_Var8)(this,tokens,0x16);
          goto LAB_00319d0e;
        }
      }
      (*p_Var8)(this,tokens,0x15);
      goto LAB_00319d23;
    case 0xe:
switchD_00319808_caseD_e:
      this_00 = this;
      (*this->_vptr_XPathScanner[2])(this,tokens,0x2f);
      local_90 = scanNumber(this_00,data,endOffset,XVar13,tokens);
LAB_00319f84:
      bVar15 = true;
      goto LAB_00319af5;
    case 0xf:
      currentOffset = XVar13 + 1;
      if ((currentOffset == endOffset) || (data[XVar13 + 1] != L':')) goto LAB_00319b15;
      (*this->_vptr_XPathScanner[2])(this,tokens,8);
LAB_00319d0e:
      local_90 = XVar13 + 2;
      goto LAB_00319aef;
    case 0x10:
      if (XVar13 + 1 == endOffset) {
        p_Var8 = this->_vptr_XPathScanner[2];
      }
      else {
        p_Var8 = this->_vptr_XPathScanner[2];
        if (data[XVar13 + 1] == L'=') {
          (*p_Var8)(this,tokens,0x1d);
          goto LAB_00319d0e;
        }
      }
      (*p_Var8)(this,tokens,0x1c);
      goto LAB_00319d23;
    case 0x11:
      (*this->_vptr_XPathScanner[2])(this,tokens,0x1a);
      break;
    case 0x12:
      if (XVar13 + 1 == endOffset) {
        p_Var8 = this->_vptr_XPathScanner[2];
      }
      else {
        p_Var8 = this->_vptr_XPathScanner[2];
        if (data[XVar13 + 1] == L'=') {
          (*p_Var8)(this,tokens,0x1f);
          goto LAB_00319d0e;
        }
      }
      (*p_Var8)(this,tokens,0x1e);
LAB_00319d23:
      local_90 = XVar13 + 1;
      bVar15 = false;
      goto LAB_00319af5;
    case 0x13:
      (*this->_vptr_XPathScanner[2])(this,tokens,6);
      break;
    case 0x14:
    case 0x17:
    case 0x19:
      currentOffset = XVar13;
      if (((ulong)(ushort)data[XVar13] != 0x3a) &&
         (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[XVar13]] & 2) != 0)) {
        uVar18 = XVar13;
        uVar19 = XVar13 + 1;
        if (XVar13 + 1 < endOffset) {
          uVar19 = endOffset;
        }
        do {
          uVar18 = uVar18 + 1;
          currentOffset = uVar19;
          if (endOffset <= uVar18) break;
          currentOffset = uVar18;
        } while (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[uVar18]] & 1) != 0);
      }
      if (currentOffset - XVar13 == 0) goto LAB_00319b15;
      if (currentOffset < endOffset) {
        uVar18 = (ulong)(ushort)data[currentOffset];
      }
      else {
        uVar18 = 0;
      }
      local_70.fIndex = 0;
      XMLBuffer::append(&local_70,data + XVar13,currentOffset - XVar13);
      pXVar3 = this->fStringPool;
      local_70.fBuffer[local_70.fIndex] = L'\0';
      iVar4 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
      if ((short)uVar18 == 0x3a) {
        XVar13 = currentOffset + 1;
        local_90 = XVar13;
        if (XVar13 != endOffset) {
          XVar16 = data[XVar13];
          uVar18 = (ulong)(ushort)XVar16;
          if (XVar16 == L':') {
            bVar20 = true;
            bVar12 = false;
          }
          else {
            if (XVar16 != L'*') {
              if ((XVar16 != L':') && (((&XMLChar1_0::fgCharCharsTable1_0)[uVar18] & 2) != 0)) {
                uVar19 = currentOffset + 2;
                uVar18 = uVar19;
                if (uVar19 < endOffset) {
                  uVar18 = endOffset;
                }
                do {
                  local_90 = uVar18;
                  if (endOffset <= uVar19) break;
                  pXVar1 = data + uVar19;
                  local_90 = uVar19;
                  uVar19 = uVar19 + 1;
                } while (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar1] & 1) != 0);
              }
              if (local_90 - XVar13 != 0) {
                if (local_90 < endOffset) {
                  uVar18 = (ulong)(ushort)data[local_90];
                }
                else {
                  uVar18 = 0;
                }
                local_70.fIndex = 0;
                XMLBuffer::append(&local_70,data + XVar13,local_90 - XVar13);
                pXVar3 = this->fStringPool;
                local_70.fBuffer[local_70.fIndex] = L'\0';
                iVar6 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])();
                bVar12 = false;
                bVar20 = false;
                currentOffset = local_90;
                local_84 = iVar4;
                iVar4 = iVar6;
                goto LAB_00319b97;
              }
              bVar20 = false;
              goto LAB_0031a259;
            }
            bVar12 = true;
            bVar20 = false;
          }
          local_84 = -1;
          currentOffset = currentOffset + 2;
          if (currentOffset < endOffset) {
            uVar18 = (ulong)(ushort)data[currentOffset];
          }
          goto LAB_00319b97;
        }
        bVar20 = false;
      }
      else {
        local_84 = -1;
        bVar12 = false;
        bVar20 = false;
LAB_00319b97:
        XVar16 = (XMLCh)uVar18;
        cVar2 = (&XMLChar1_0::fgCharCharsTable1_0)[uVar18];
        local_90 = currentOffset;
        while ((cVar2 < '\0' && (XVar13 = local_90 + 1, local_90 = endOffset, XVar13 != endOffset)))
        {
          XVar16 = data[XVar13];
          cVar2 = (&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar16];
          local_90 = XVar13;
        }
        if (bVar15) {
          uVar11 = 0x10;
          if ((((iVar4 != this->fAndSymbol) && (uVar11 = 0x11, iVar4 != this->fOrSymbol)) &&
              (uVar11 = 0x12, iVar4 != this->fModSymbol)) &&
             (uVar11 = 0x13, iVar4 != this->fDivSymbol)) {
LAB_0031a2ed:
            bVar20 = false;
            goto LAB_0031a259;
          }
          (*this->_vptr_XPathScanner[2])(this,tokens,uVar11);
          bVar20 = (bool)((bVar12 | bVar20) ^ 1);
        }
        else {
          if ((bVar20 || bVar12) || XVar16 != L'(') {
            if ((!bVar20) &&
               (((XVar16 != L':' || (endOffset <= local_90 + 1)) || (data[local_90 + 1] != L':'))))
            {
              if (bVar12) {
                (*this->_vptr_XPathScanner[2])(this,tokens,10);
                ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
              }
              else {
                (*this->_vptr_XPathScanner[2])(this,tokens,0xb);
                ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
                XVar13 = tokens->fCurCount;
                tokens->fCurCount = XVar13 + 1;
                tokens->fElemList[XVar13] = local_84;
                ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
              }
              XVar13 = tokens->fCurCount;
              tokens->fCurCount = XVar13 + 1;
              tokens->fElemList[XVar13] = iVar4;
              bVar15 = true;
              bVar20 = true;
              goto LAB_0031a259;
            }
            uVar11 = 0x21;
            if (((((iVar4 != this->fAncestorSymbol) &&
                  (uVar11 = 0x22, iVar4 != this->fAncestorOrSelfSymbol)) &&
                 ((uVar11 = 0x23, iVar4 != this->fAttributeSymbol &&
                  (((((uVar11 = 0x24, iVar4 != this->fChildSymbol &&
                      (uVar11 = 0x25, iVar4 != this->fDescendantSymbol)) &&
                     (uVar11 = 0x26, iVar4 != this->fDescendantOrSelfSymbol)) &&
                    ((uVar11 = 0x27, iVar4 != this->fFollowingSymbol &&
                     (uVar11 = 0x28, iVar4 != this->fFollowingSiblingSymbol)))) &&
                   (uVar11 = 0x29, iVar4 != this->fNamespaceSymbol)))))) &&
                ((uVar11 = 0x2a, iVar4 != this->fParentSymbol &&
                 (uVar11 = 0x2b, iVar4 != this->fPrecedingSymbol)))) &&
               ((uVar11 = 0x2c, iVar4 != this->fPrecedingSiblingSymbol &&
                (uVar11 = 0x2d, iVar4 != this->fSelfSymbol)))) goto LAB_0031a2ed;
            (*this->_vptr_XPathScanner[2])(this,tokens,uVar11);
            if (bVar12) {
              bVar20 = false;
              goto LAB_0031a259;
            }
            (*this->_vptr_XPathScanner[2])(this,tokens,8);
            if (!bVar20) {
              local_90 = local_90 + 2;
            }
          }
          else {
            uVar11 = 0xc;
            if (((iVar4 == this->fCommentSymbol) || (uVar11 = 0xd, iVar4 == this->fTextSymbol)) ||
               (uVar11 = 0xe, iVar4 == this->fPISymbol)) {
              p_Var8 = this->_vptr_XPathScanner[2];
LAB_00319f30:
              (*p_Var8)(this,tokens,uVar11);
            }
            else {
              p_Var8 = this->_vptr_XPathScanner[2];
              uVar11 = 0xf;
              if (iVar4 == this->fNodeSymbol) goto LAB_00319f30;
              (*p_Var8)(this,tokens,0x20);
              ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
              XVar13 = tokens->fCurCount;
              tokens->fCurCount = XVar13 + 1;
              tokens->fElemList[XVar13] = local_84;
              ValueVectorOf<int>::ensureExtraCapacity(tokens,1);
              XVar13 = tokens->fCurCount;
              tokens->fCurCount = XVar13 + 1;
              tokens->fElemList[XVar13] = iVar4;
            }
            (*this->_vptr_XPathScanner[2])(this,tokens,0);
            local_90 = local_90 + 1;
          }
          bVar20 = true;
        }
        bVar15 = false;
      }
LAB_0031a259:
      if (!bVar20) goto LAB_0031a262;
      goto LAB_00319af5;
    case 0x15:
      (*this->_vptr_XPathScanner[2])(this,tokens,2);
      break;
    case 0x16:
      (*this->_vptr_XPathScanner[2])(this,tokens,3);
LAB_003199e8:
      local_90 = XVar13 + 1;
LAB_003199eb:
      bVar15 = true;
      goto LAB_00319af5;
    case 0x18:
      (*this->_vptr_XPathScanner[2])(this,tokens,0x17);
      break;
    default:
      local_74[1] = 0;
      pXVar9 = (XPathException *)__cxa_allocate_exception(0x30);
      XPathException::XPathException
                (pXVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                 ,0x539,XPath_InvalidChar,local_74,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 tokens->fMemoryManager);
      __cxa_throw(pXVar9,&XPathException::typeinfo,XMLException::~XMLException);
    }
    local_90 = XVar13 + 1;
LAB_00319aef:
    bVar15 = false;
LAB_00319af5:
    bVar20 = true;
    currentOffset = local_90;
LAB_00319afa:
  } while (bVar20);
  bVar20 = false;
LAB_0031a411:
  (*(local_70.fMemoryManager)->_vptr_MemoryManager[4])(local_70.fMemoryManager,local_70.fBuffer);
  return bVar20;
}

Assistant:

bool XPathScanner::scanExpression(const XMLCh* const data,
                                  XMLSize_t currentOffset,
                                  const XMLSize_t endOffset,
                                  ValueVectorOf<int>* const tokens) {

    bool      starIsMultiplyOperator = false;
    XMLSize_t nameOffset = 0;
    int       nameHandle = -1;
    int       prefixHandle = -1;
    XMLCh     ch;
    XMLBuffer dataBuffer(128, tokens->getMemoryManager());

    while (currentOffset != endOffset) {

        ch = data[currentOffset];

        while (XMLChar1_0::isWhitespace(ch)) {

            if (++currentOffset == endOffset) {
                break;
            }

            ch = data[currentOffset];
        }

        if (currentOffset == endOffset) {
            break;
        }
        //
        // [28] ExprToken ::= '(' | ')' | '[' | ']' | '.' | '..' | '@' | ',' | '::'
        //                  | NameTest | NodeType | Operator | FunctionName
        //                  | AxisName | Literal | Number | VariableReference
        //
        XMLByte chartype = (ch >= 0x80) ? (XMLByte)CHARTYPE_NONASCII : fASCIICharMap[ch];

        switch (chartype) {
        case CHARTYPE_OPEN_PAREN:       // '('
            addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_PAREN);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_CLOSE_PAREN:      // ')'
            addToken(tokens, XercesXPath::EXPRTOKEN_CLOSE_PAREN);
            starIsMultiplyOperator = true;
            ++currentOffset;
            break;
        case CHARTYPE_OPEN_BRACKET:     // '['
            addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_BRACKET);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_CLOSE_BRACKET:    // ']'
            addToken(tokens, XercesXPath::EXPRTOKEN_CLOSE_BRACKET);
            starIsMultiplyOperator = true;
            ++currentOffset;
            break;
                //
                // [30] Number ::= Digits ('.' Digits?)? | '.' Digits
                //                                         ^^^^^^^^^^
                //
        case CHARTYPE_PERIOD:           // '.', '..' or '.' Digits
            if (currentOffset + 1 == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
                break;
            }

            ch = data[currentOffset + 1];

            if (ch == chPeriod) {            // '..'
                addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset += 2;
            } else if (ch >= chDigit_0 && ch <= chDigit_9) {
                addToken(tokens, XercesXPath::EXPRTOKEN_NUMBER);
                starIsMultiplyOperator = true;
                currentOffset = scanNumber(data, endOffset, currentOffset, tokens);
            } else if (ch == chForwardSlash) {
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
            } else if (ch == chPipe) { // '|'
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
            } else if (XMLChar1_0::isWhitespace(ch)) {
                do {
                    if (++currentOffset == endOffset)
                        break;

                    ch = data[currentOffset];
                } while (XMLChar1_0::isWhitespace(ch));

                if (currentOffset == endOffset || ch == chPipe || ch == chForwardSlash) {
				    addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                    starIsMultiplyOperator = true;
                    break;
                }
            } else {
                XMLCh str[2]= {ch, 0 };
                ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_InvalidChar, str, tokens->getMemoryManager());
            }

            break;
        case CHARTYPE_ATSIGN:           // '@'
            addToken(tokens, XercesXPath::EXPRTOKEN_ATSIGN);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_COMMA:            // ','
            addToken(tokens, XercesXPath::EXPRTOKEN_COMMA);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_COLON:            // '::'
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }
            ch = data[currentOffset];

            if (ch != chColon) {
                return false; // REVISIT
            }
            addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_COLON);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_SLASH:            // '/' and '//'
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_SLASH);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chForwardSlash) { // '//'
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_SLASH);
                starIsMultiplyOperator = false;
            }
            break;
        case CHARTYPE_UNION:            // '|'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_UNION);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_PLUS:             // '+'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_PLUS);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_MINUS:            // '-'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MINUS);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_EQUAL:            // '='
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_EQUAL);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_EXCLAMATION:      // '!='
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }

            ch = data[currentOffset];

            if (ch != chEqual) {
                return false; // REVISIT
            }

            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_NOT_EQUAL);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_LESS: // '<' and '<='
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chEqual) { // '<='
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS_EQUAL);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS);
                starIsMultiplyOperator = false;
            }
            break;
        case CHARTYPE_GREATER: // '>' and '>='
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chEqual) { // '>='
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER_EQUAL);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER);
                starIsMultiplyOperator = false;
            }
            break;
        //
        // [29] Literal ::= '"' [^"]* '"' | "'" [^']* "'"
        //
        case CHARTYPE_QUOTE:            // '\"' or '\''
            {
                XMLCh qchar = ch;
                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }

                ch = data[currentOffset];

                XMLSize_t litOffset = currentOffset;
                while (ch != qchar) {
                    if (++currentOffset == endOffset) {
                        return false; // REVISIT
                    }

                    ch = data[currentOffset];
                }

                addToken(tokens, XercesXPath::EXPRTOKEN_LITERAL);
                starIsMultiplyOperator = true;

                dataBuffer.set(data + litOffset, currentOffset - litOffset);
                tokens->addElement(fStringPool->addOrFind(dataBuffer.getRawBuffer()));
                ++currentOffset;
                break;
            }
        //
        // [30] Number ::= Digits ('.' Digits?)? | '.' Digits
        // [31] Digits ::= [0-9]+
        //
        case CHARTYPE_DIGIT:
            addToken(tokens, XercesXPath::EXPRTOKEN_NUMBER);
            starIsMultiplyOperator = true;
            currentOffset = scanNumber(data, endOffset, currentOffset, tokens);
            break;
        //
        // [36] VariableReference ::= '$' QName
        //
        case CHARTYPE_DOLLAR:
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }
            nameOffset = currentOffset;
            currentOffset = scanNCName(data, endOffset, currentOffset);

            if (currentOffset == nameOffset) {
                return false; // REVISIT
            }

            if (currentOffset < endOffset) {
                ch = data[currentOffset];
            }
            else {
                ch = 0;
            }

            dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
            nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
            prefixHandle = -1;

            if (ch == chColon) {

                prefixHandle = nameHandle;
                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }
                nameOffset = currentOffset;
                currentOffset = scanNCName(data, endOffset, currentOffset);

                if (currentOffset == nameOffset) {
                    return false; // REVISIT
                }

                dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
                nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
            }
            addToken(tokens, XercesXPath::EXPRTOKEN_VARIABLE_REFERENCE);
            starIsMultiplyOperator = true;
            tokens->addElement(prefixHandle);
            tokens->addElement(nameHandle);
            break;
        //
        // [37] NameTest ::= '*' | NCName ':' '*' | QName
        // [34] MultiplyOperator ::= '*'
        //
        case CHARTYPE_STAR:             // '*'
            //
            // 3.7 Lexical Structure
            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then a * must be recognized as a MultiplyOperator.
            //
            // Otherwise, the token must not be recognized as a MultiplyOperator.
            //
            if (starIsMultiplyOperator) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MULT);
                starIsMultiplyOperator = false;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_ANY);
                starIsMultiplyOperator = true;
            }

            ++currentOffset;
            break;
        //
        // NCName, QName and non-terminals
        //
        case CHARTYPE_NONASCII: // possibly a valid non-ascii 'Letter' (BaseChar | Ideographic)
        case CHARTYPE_LETTER:
        case CHARTYPE_UNDERSCORE:
            {
            //
            // 3.7 Lexical Structure
            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then an NCName must be recognized as an OperatorName.
            //
            //  If the character following an NCName (possibly after intervening ExprWhitespace) is (,
            //  then the token must be recognized as a NodeType or a FunctionName.
            //
            //  If the two characters following an NCName (possibly after intervening ExprWhitespace)
            //  are ::, then the token must be recognized as an AxisName.
            //
            //  Otherwise, the token must not be recognized as an OperatorName, a NodeType, a
            //  FunctionName, or an AxisName.
            //
            // [33] OperatorName ::= 'and' | 'or' | 'mod' | 'div'
            // [38] NodeType ::= 'comment' | 'text' | 'processing-instruction' | 'node'
            // [35] FunctionName ::= QName - NodeType
            // [6] AxisName ::= (see above)
            //
            // [37] NameTest ::= '*' | NCName ':' '*' | QName
            // [5] NCName ::= (Letter | '_') (NCNameChar)*
            // [?] NCNameChar ::= Letter | Digit | '.' | '-' | '_'  (ascii subset of 'NCNameChar')
            // [?] QName ::= (NCName ':')? NCName
            // [?] Letter ::= [A-Za-z]                              (ascii subset of 'Letter')
            // [?] Digit ::= [0-9]                                  (ascii subset of 'Digit')
            //
            nameOffset = currentOffset;
            currentOffset = scanNCName(data, endOffset, currentOffset);
            if (currentOffset == nameOffset) {
                return false; // REVISIT
			}

            if (currentOffset < endOffset) {
                ch = data[currentOffset];
            }
            else {
                ch = 0;
            }

            dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
            nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());

            bool isNameTestNCName = false;
            bool isAxisName = false;
            prefixHandle = -1;

            if (ch == chColon) {

                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }

                ch = data[currentOffset];

                if (ch == chAsterisk) {
                    if (++currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }

                    isNameTestNCName = true;
                } else if (ch == chColon) {
                    if (++currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }

                    isAxisName = true;
                } else {
                    prefixHandle = nameHandle;
                    nameOffset = currentOffset;
                    currentOffset = scanNCName(data, endOffset, currentOffset);
                    if (currentOffset == nameOffset) {
                        return false; // REVISIT
                    }
                    if (currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }
                    else {
                        ch = 0;
                    }

                    dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
                    nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
                }
            }
            //
            // [39] ExprWhitespace ::= S
            //
            while (XMLChar1_0::isWhitespace(ch)) {
                if (++currentOffset == endOffset) {
                    break;
                }
                ch = data[currentOffset];
            }

            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then an NCName must be recognized as an OperatorName.
            //
            if (starIsMultiplyOperator) {
                if (nameHandle == fAndSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_AND);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fOrSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_OR);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fModSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MOD);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fDivSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_DIV);
                    starIsMultiplyOperator = false;
                } else {
                    return false; // REVISIT
                }

                if (isNameTestNCName) {
                    return false; // REVISIT - NCName:* where an OperatorName is required
                } else if (isAxisName) {
                    return false; // REVISIT - AxisName:: where an OperatorName is required
                }
                break;
            }
            //
            //  If the character following an NCName (possibly after intervening ExprWhitespace) is (,
            //  then the token must be recognized as a NodeType or a FunctionName.
            //
            if (ch == chOpenParen && !isNameTestNCName && !isAxisName) {
                if (nameHandle == fCommentSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_COMMENT);
                } else if (nameHandle == fTextSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_TEXT);
                } else if (nameHandle == fPISymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_PI);
                } else if (nameHandle == fNodeSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_NODE);
                } else {
                    addToken(tokens, XercesXPath::EXPRTOKEN_FUNCTION_NAME);
                    tokens->addElement(prefixHandle);
                    tokens->addElement(nameHandle);
                }
                addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_PAREN);
                starIsMultiplyOperator = false;
                ++currentOffset;
                break;
            }

            //
            //  If the two characters following an NCName (possibly after intervening ExprWhitespace)
            //  are ::, then the token must be recognized as an AxisName.
            //
            if (isAxisName ||
                (ch == chColon && currentOffset + 1 < endOffset &&
                 data[currentOffset + 1] == chColon)) {

                if (nameHandle == fAncestorSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ANCESTOR);
                } else if (nameHandle == fAncestorOrSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ANCESTOR_OR_SELF);
                } else if (nameHandle == fAttributeSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ATTRIBUTE);
                } else if (nameHandle == fChildSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_CHILD);
                } else if (nameHandle == fDescendantSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_DESCENDANT);
                } else if (nameHandle == fDescendantOrSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_DESCENDANT_OR_SELF);
                } else if (nameHandle == fFollowingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_FOLLOWING);
                } else if (nameHandle == fFollowingSiblingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_FOLLOWING_SIBLING);
                } else if (nameHandle == fNamespaceSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_NAMESPACE);
                } else if (nameHandle == fParentSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PARENT);
                } else if (nameHandle == fPrecedingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PRECEDING);
                } else if (nameHandle == fPrecedingSiblingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PRECEDING_SIBLING);
                } else if (nameHandle == fSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_SELF);
                } else {
                    return false; // REVISIT
                }

                if (isNameTestNCName) {
                    return false; // REVISIT - "NCName:* ::" where "AxisName ::" is required
                }

                addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_COLON);
                starIsMultiplyOperator = false;
                if (!isAxisName) {
                    currentOffset += 2;
                }
                break;
            }
            //
            //  Otherwise, the token must not be recognized as an OperatorName, a NodeType, a
            //  FunctionName, or an AxisName.
            //
            if (isNameTestNCName) {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE);
                tokens->addElement(nameHandle);
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_QNAME);
                tokens->addElement(prefixHandle);
                tokens->addElement(nameHandle);
            }

            starIsMultiplyOperator = true;
            break;
            }
        default:
            {
            XMLCh str[2]= {ch, 0 };
            ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_InvalidChar, str, tokens->getMemoryManager());
            break;
            }
        }
    }

    return true;
}